

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O1

void __thiscall
MxxReduce_GlobalExScan_Test::~MxxReduce_GlobalExScan_Test(MxxReduce_GlobalExScan_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxReduce, GlobalExScan) {
    mxx::comm c;
    // test reduce with zero elements for some processes
    size_t n = 0;
    int presize = 0;
    if (c.rank() % 2 == 0) {
        n = (c.rank()/2+1);
        presize = n*(n-1)/2;
    }
    std::vector<int> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = presize + i + 1;
    }
    // test inplace exscan
    std::vector<int> local_cpy(local);
    mxx::global_exscan_inplace(local_cpy, std::plus<int>(), c);
    for (size_t i = 0; i < n; ++i) {
        ASSERT_EQ(local[i]*(local[i]-1)/2, local_cpy[i]);
    }
    // test exscan
    std::vector<int> result = mxx::global_exscan(local);
    ASSERT_EQ(local.size(), result.size());
    for (size_t i = 0; i < n; ++i) {
        ASSERT_EQ(local[i]*(local[i]-1)/2, result[i]);
    }
}